

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::Recycle
          (VulkanSyncObjectManager *this,VkFenceType vkFence,bool IsUnsignaled)

{
  undefined7 in_register_00000011;
  VkFenceType vkFence_local;
  
  vkFence_local.Value = vkFence.Value;
  if ((int)CONCAT71(in_register_00000011,IsUnsignaled) == 0) {
    (*vkResetFences)(this->m_LogicalDevice->m_VkDevice,1,&vkFence_local.Value);
  }
  std::mutex::lock(&this->m_FencePoolGuard);
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::push_back
            (&this->m_FencePool,&vkFence_local.Value);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_FencePoolGuard);
  return;
}

Assistant:

void VulkanSyncObjectManager::Recycle(VkFenceType vkFence, bool IsUnsignaled)
{
    if (!IsUnsignaled)
    {
        // Access to vkFence must be externally synchronized, we assume that vkFence is not used anywhere else.
        vkResetFences(m_LogicalDevice.GetVkDevice(), 1, &vkFence.Value);
    }

    std::lock_guard<std::mutex> Lock{m_FencePoolGuard};
    m_FencePool.push_back(vkFence.Value);
}